

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi_tests.cpp
# Opt level: O0

void __thiscall
test::spi_test::iu_SPITest_x_iutest_x_NonFatalFailure2_Test::
~iu_SPITest_x_iutest_x_NonFatalFailure2_Test(iu_SPITest_x_iutest_x_NonFatalFailure2_Test *this)

{
  iu_SPITest_x_iutest_x_NonFatalFailure2_Test *this_local;
  
  ~iu_SPITest_x_iutest_x_NonFatalFailure2_Test(this);
  operator_delete(this,0x150);
  return;
}

Assistant:

IUTEST_F(SPITest, NonFatalFailure2)
{
    #define FLAVOR(n) IUTEST_EXPECT##n
    #define FAILURE_MACRO IUTEST_EXPECT_NONFATAL_FAILURE

#include "spi_tests_decl.cpp"

    #undef FLAVOR
    #undef FAILURE_MACRO
}